

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

void __thiscall CTcCodeStream::alloc_line_pages(CTcCodeStream *this,size_t number_to_add)

{
  tcgen_line_page_t **pptVar1;
  tcgen_line_page_t *ptVar2;
  ulong uVar3;
  size_t sVar4;
  
  sVar4 = this->line_pages_alloc_;
  uVar3 = sVar4 + number_to_add;
  if (this->line_pages_ == (tcgen_line_page_t **)0x0) {
    pptVar1 = (tcgen_line_page_t **)malloc(uVar3 * 8);
  }
  else {
    pptVar1 = (tcgen_line_page_t **)realloc(this->line_pages_,uVar3 * 8);
    sVar4 = this->line_pages_alloc_;
    uVar3 = sVar4 + number_to_add;
  }
  this->line_pages_ = pptVar1;
  for (; sVar4 < uVar3; sVar4 = sVar4 + 1) {
    ptVar2 = (tcgen_line_page_t *)malloc(0x6000);
    this->line_pages_[sVar4] = ptVar2;
    uVar3 = this->line_pages_alloc_ + number_to_add;
  }
  this->line_pages_alloc_ = uVar3;
  return;
}

Assistant:

void CTcCodeStream::alloc_line_pages(size_t number_to_add)
{
    size_t siz;
    size_t i;

    /* create or expand the master page array */
    siz = (line_pages_alloc_ + number_to_add) * sizeof(tcgen_line_page_t *);
    if (line_pages_ == 0)
        line_pages_ = (tcgen_line_page_t **)t3malloc(siz);
    else
        line_pages_ = (tcgen_line_page_t **)t3realloc(line_pages_, siz);

    /* allocate the new pages */
    for (i = line_pages_alloc_ ; i < line_pages_alloc_ + number_to_add ; ++i)
    {
        /* allocate this page */
        line_pages_[i] = (tcgen_line_page_t *)
                         t3malloc(sizeof(tcgen_line_page_t));
    }

    /* remember the new allocation */
    line_pages_alloc_ += number_to_add;
}